

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void mainSimpleSort(UInt32 *ptr,UChar *block,UInt16 *quadrant,Int32 nblock,Int32 lo,Int32 hi,Int32 d
                   ,Int32 *budget)

{
  int iVar1;
  Bool BVar2;
  int iVar3;
  UInt32 in_ECX;
  UInt16 *in_RDX;
  UChar *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  UInt32 v;
  Int32 hp;
  Int32 bigN;
  Int32 h;
  Int32 j;
  Int32 i;
  int local_38;
  int local_2c;
  int local_28;
  
  iVar3 = (in_R9D - in_R8D) + 1;
  if (1 < iVar3) {
    for (local_38 = 0; incs[local_38] < iVar3; local_38 = local_38 + 1) {
    }
LAB_0011718a:
    local_38 = local_38 + -1;
    if (-1 < local_38) {
      iVar3 = incs[local_38];
      local_28 = in_R8D + iVar3;
      while (local_28 <= in_R9D) {
        iVar1 = *(int *)(in_RDI + (long)local_28 * 4);
        local_2c = local_28;
        do {
          BVar2 = mainGtU(*(int *)(in_RDI + (long)(local_2c - iVar3) * 4) + in_stack_00000008,
                          iVar1 + in_stack_00000008,in_RSI,in_RDX,in_ECX,_hp);
          if (BVar2 == '\0') break;
          *(undefined4 *)(in_RDI + (long)local_2c * 4) =
               *(undefined4 *)(in_RDI + (long)(local_2c - iVar3) * 4);
          local_2c = local_2c - iVar3;
        } while (in_R8D + iVar3 + -1 < local_2c);
        *(int *)(in_RDI + (long)local_2c * 4) = iVar1;
        local_2c = local_28 + 1;
        if (in_R9D < local_2c) break;
        iVar1 = *(int *)(in_RDI + (long)local_2c * 4);
        do {
          BVar2 = mainGtU(*(int *)(in_RDI + (long)(local_2c - iVar3) * 4) + in_stack_00000008,
                          iVar1 + in_stack_00000008,in_RSI,in_RDX,in_ECX,_hp);
          if (BVar2 == '\0') break;
          *(undefined4 *)(in_RDI + (long)local_2c * 4) =
               *(undefined4 *)(in_RDI + (long)(local_2c - iVar3) * 4);
          local_2c = local_2c - iVar3;
        } while (in_R8D + iVar3 + -1 < local_2c);
        *(int *)(in_RDI + (long)local_2c * 4) = iVar1;
        local_2c = local_28 + 2;
        if (in_R9D < local_2c) break;
        iVar1 = *(int *)(in_RDI + (long)local_2c * 4);
        do {
          BVar2 = mainGtU(*(int *)(in_RDI + (long)(local_2c - iVar3) * 4) + in_stack_00000008,
                          iVar1 + in_stack_00000008,in_RSI,in_RDX,in_ECX,_hp);
          if (BVar2 == '\0') break;
          *(undefined4 *)(in_RDI + (long)local_2c * 4) =
               *(undefined4 *)(in_RDI + (long)(local_2c - iVar3) * 4);
          local_2c = local_2c - iVar3;
        } while (in_R8D + iVar3 + -1 < local_2c);
        *(int *)(in_RDI + (long)local_2c * 4) = iVar1;
        local_28 = local_28 + 3;
        if (*_hp < 0) {
          return;
        }
      }
      goto LAB_0011718a;
    }
  }
  return;
}

Assistant:

static
void mainSimpleSort ( UInt32* ptr,
                      UChar*  block,
                      UInt16* quadrant,
                      Int32   nblock,
                      Int32   lo, 
                      Int32   hi, 
                      Int32   d,
                      Int32*  budget )
{
   Int32 i, j, h, bigN, hp;
   UInt32 v;

   bigN = hi - lo + 1;
   if (bigN < 2) return;

   hp = 0;
   while (incs[hp] < bigN) hp++;
   hp--;

   for (; hp >= 0; hp--) {
      h = incs[hp];

      i = lo + h;
      while (True) {

         /*-- copy 1 --*/
         if (i > hi) break;
         v = ptr[i];
         j = i;
         while ( mainGtU ( 
                    ptr[j-h]+d, v+d, block, quadrant, nblock, budget 
                 ) ) {
            ptr[j] = ptr[j-h];
            j = j - h;
            if (j <= (lo + h - 1)) break;
         }
         ptr[j] = v;
         i++;

         /*-- copy 2 --*/
         if (i > hi) break;
         v = ptr[i];
         j = i;
         while ( mainGtU ( 
                    ptr[j-h]+d, v+d, block, quadrant, nblock, budget 
                 ) ) {
            ptr[j] = ptr[j-h];
            j = j - h;
            if (j <= (lo + h - 1)) break;
         }
         ptr[j] = v;
         i++;

         /*-- copy 3 --*/
         if (i > hi) break;
         v = ptr[i];
         j = i;
         while ( mainGtU ( 
                    ptr[j-h]+d, v+d, block, quadrant, nblock, budget 
                 ) ) {
            ptr[j] = ptr[j-h];
            j = j - h;
            if (j <= (lo + h - 1)) break;
         }
         ptr[j] = v;
         i++;

         if (*budget < 0) return;
      }
   }
}